

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_decals.cpp
# Opt level: O0

void __thiscall ON_Decal::CImpl::SetIsVisible(CImpl *this,bool b)

{
  ON_XMLVariant local_110;
  uint local_18;
  undefined1 local_11;
  int i;
  bool b_local;
  CImpl *this_local;
  
  local_18 = (uint)b;
  if ((this->_cache).visible != local_18) {
    (this->_cache).visible = local_18;
    local_11 = b;
    _i = this;
    ::ON_XMLVariant::ON_XMLVariant(&local_110,b);
    SetParameter(this,L"is-visible",&local_110);
    ::ON_XMLVariant::~ON_XMLVariant(&local_110);
  }
  return;
}

Assistant:

void ON_Decal::CImpl::SetIsVisible(bool b)
{
  const int i = b ? 1 : 0;
  if (_cache.visible != i)
  {
    _cache.visible = i;
    SetParameter(ON_RDK_DECAL_IS_VISIBLE, b);
  }
}